

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O0

int protodec_calculate_crc(int length_bits,demod_state_t *d)

{
  unsigned_short uVar1;
  uint len;
  int iVar2;
  uchar *data;
  byte local_39;
  unsigned_short crc;
  uchar tmp;
  int x;
  int j;
  int i;
  int buflen;
  uchar *buf;
  int length_bytes;
  demod_state_t *d_local;
  int length_bits_local;
  
  if (length_bits < 1) {
    d_local._4_4_ = 0;
  }
  else {
    len = length_bits / 8 + 2;
    data = (uchar *)hmalloc((long)(int)len);
    for (_crc = 0; _crc < (int)len; _crc = _crc + 1) {
      local_39 = 0;
      for (x = 0; x < 8; x = x + 1) {
        local_39 = local_39 | d->buffer[x + _crc * 8] << ((byte)x & 0x1f);
      }
      data[_crc] = local_39;
    }
    uVar1 = protodec_sdlc_crc(data,len);
    memset(d->rbuffer,0,0x1c2);
    for (_crc = 0; _crc < length_bits / 8; _crc = _crc + 1) {
      for (x = 0; x < 8; x = x + 1) {
        iVar2 = _crc * 8 + x;
        if (0x1c1 < iVar2) {
          hfree(data);
          return 0;
        }
        d->rbuffer[iVar2] = (byte)((int)(uint)data[_crc] >> (7U - (char)x & 0x1f)) & 1;
      }
    }
    hfree(data);
    d_local._4_4_ = (uint)(uVar1 == 0xf47);
  }
  return d_local._4_4_;
}

Assistant:

int protodec_calculate_crc(int length_bits, struct demod_state_t *d)
{
	int length_bytes;
	unsigned char *buf;
	int buflen;
	int i, j, x;
	unsigned char tmp;
	
	if (length_bits <= 0) {
		return 0;
	}
	
	length_bytes = length_bits / 8;
	buflen = length_bytes + 2;
	
	/* what is this? */
	buf = (unsigned char *) hmalloc(sizeof(*buf) * buflen);
	for (j = 0; j < buflen; j++) {
		tmp = 0;
		for (i = 0; i < 8; i++)
			tmp |= (((d->buffer[i + 8 * j]) << (i)));
		buf[j] = tmp;
	}
	
	/* ok, here's the actual CRC calculation */
	unsigned short crc = protodec_sdlc_crc(buf, buflen);
	//DBG(printf("CRC: %04x\n",crc));
	
	/* what is this? */
	memset(d->rbuffer, 0, DEMOD_BUFFER_LEN);
	for (j = 0; j < length_bytes; j++) {
		for (i = 0; i < 8; i++) {
			x = j * 8 + i;
			if (x >= DEMOD_BUFFER_LEN) {
				hfree(buf);
				return 0;
			} else {
				d->rbuffer[x] = (buf[j] >> (7 - i)) & 1;
			}
		}
	}
	
	hfree(buf);
	
	return (crc == 0x0f47);
}